

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

ON_SubDVertexSurfacePointCoefficient *
ON_SubDVertexSurfacePointCoefficient::Create
          (ON_SubDVertex *limit_point_vertex,ON_SubDVertex *ring_vertex,double x)

{
  ON_SubDVertexSurfacePointCoefficient *in_RDI;
  
  in_RDI->m_limit_point_vertex = (ON_SubDVertex *)0x0;
  in_RDI->m_ring_vertex = (ON_SubDVertex *)0x0;
  in_RDI->m_limit_point_vertex = limit_point_vertex;
  in_RDI->m_ring_vertex = ring_vertex;
  in_RDI->m_c = x;
  return in_RDI;
}

Assistant:

const ON_SubDVertexSurfacePointCoefficient ON_SubDVertexSurfacePointCoefficient::Create(
  const ON_SubDVertex* limit_point_vertex,
  const ON_SubDVertex* ring_vertex,
  double x
)
{
  ON_SubDVertexSurfacePointCoefficient c;
  c.m_limit_point_vertex = limit_point_vertex;
  c.m_ring_vertex = ring_vertex;
  c.m_c = x;
  //DebugAt(c)
  return c;
}